

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

void __thiscall Clasp::Cli::ClaspAppBase::printTemplate(ClaspAppBase *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ConfigIter it;
  ConfigIter local_20;
  
  printf("# clasp %s configuration file\n# A configuration file contains a (possibly empty) list of configurations.\n# Each of which must have the following format:\n#   <name>[(<base>)]: <cmd>\n# where\n# <name> is an alphanumeric identifier optionally enclosed in brackets,\n# <base> is the name of one of clasp\'s default configs and optional, and\n# <cmd>  is a command-line string of clasp options in long-format, e.g.\n# (\'--heuristic=vsids --restarts=L,100\').\n#\n# SEE: clasp --help=3\n#\n# NOTE: The options \'--configuration\' and \'--tester\' must not occur in a\n#       configuration file. All other global options are ignored unless\n#       explicitly given in the very first configuration after the colon.\n#       In particular, global options from base configurations are ignored.\n#\n# NOTE: Options given on the command-line are added to all configurations in a\n#       configuration file. If an option is given both on the command-line and\n#       in a configuration file, the one from the command-line is preferred.\n#\n# NOTE: If, after adding command-line options, a configuration\n#       contains mutually exclusive options an error is raised.\n#\n# EXAMPLE: To create a new config based on clasp\'s inbuilt tweety configuration\n#          with global options but a different heuristic one could write:\n#\n#            \'Config1(tweety): --eq=3 --trans-ext=dynamic --heuristic=domain\'\n#\n#          \'Config1\' is the purely descriptive name of the configuration and could\n#          also be written as \'[Config1]\'. The following \'(tweety)\' indicates that\n#          our configuration should be based on clasp\'s tweety configuration. Finally,\n#          since global options from base configurations are ignored, we explicitly add\n#          tweety\'s global options \'--eq=3 --trans-ext=dynamic\' after the colon.\n#\n"
         ,"3.4.0");
  local_20 = ClaspCliConfig::getConfig(config_many);
  bVar1 = ConfigIter::valid(&local_20);
  if (bVar1) {
    do {
      pcVar2 = ConfigIter::name(&local_20);
      pcVar3 = ConfigIter::args(&local_20);
      printf("%s: %s\n",pcVar2,pcVar3);
      ConfigIter::next(&local_20);
      bVar1 = ConfigIter::valid(&local_20);
    } while (bVar1);
  }
  return;
}

Assistant:

void ClaspAppBase::printTemplate() const {
	printf(
		"# clasp %s configuration file\n"
		"# A configuration file contains a (possibly empty) list of configurations.\n"
		"# Each of which must have the following format:\n"
		"#   <name>[(<base>)]: <cmd>\n"
		"# where\n"
		"# <name> is an alphanumeric identifier optionally enclosed in brackets,\n"
		"# <base> is the name of one of clasp's default configs and optional, and\n"
		"# <cmd>  is a command-line string of clasp options in long-format, e.g.\n"
		"# ('--heuristic=vsids --restarts=L,100').\n"
		"#\n"
		"# SEE: clasp --help=3\n"
		"#\n"
		"# NOTE: The options '--configuration' and '--tester' must not occur in a\n"
		"#       configuration file. All other global options are ignored unless\n"
		"#       explicitly given in the very first configuration after the colon.\n"
		"#       In particular, global options from base configurations are ignored.\n"
		"#\n"
		"# NOTE: Options given on the command-line are added to all configurations in a\n"
		"#       configuration file. If an option is given both on the command-line and\n"
		"#       in a configuration file, the one from the command-line is preferred.\n"
		"#\n"
		"# NOTE: If, after adding command-line options, a configuration\n"
		"#       contains mutually exclusive options an error is raised.\n"
		"#\n"
		"# EXAMPLE: To create a new config based on clasp's inbuilt tweety configuration\n"
		"#          with global options but a different heuristic one could write:\n"
		"#\n"
		"#            'Config1(tweety): --eq=3 --trans-ext=dynamic --heuristic=domain'\n"
		"#\n"
		"#          'Config1' is the purely descriptive name of the configuration and could\n"
		"#          also be written as '[Config1]'. The following '(tweety)' indicates that\n"
		"#          our configuration should be based on clasp's tweety configuration. Finally,\n"
		"#          since global options from base configurations are ignored, we explicitly add\n"
		"#          tweety's global options '--eq=3 --trans-ext=dynamic' after the colon.\n"
		"#\n", CLASP_VERSION);
	for (ConfigIter it = ClaspCliConfig::getConfig(Clasp::Cli::config_many); it.valid(); it.next()) {
		printf("%s: %s\n", it.name(), it.args());
	}
}